

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

mcu8str * mcu8str_view_cstr(char *c_str)

{
  mcu8str_size_t mVar1;
  char *in_RSI;
  mcu8str *in_RDI;
  mcu8str *s;
  
  in_RDI->c_str = in_RSI;
  mVar1 = mctools_strlen((char *)s,(mcu8str_size_t)in_RSI);
  in_RDI->size = (uint)mVar1;
  in_RDI->buflen = in_RDI->size + 1;
  in_RDI->owns_memory = 0;
  return in_RDI;
}

Assistant:

mcu8str mcu8str_view_cstr( const char * c_str )
  {
    mcu8str s;
    s.c_str = (char*)c_str;//cast away constness, but we will add it again in
                           //the return type (in c++).
    s.size = (unsigned)mctools_strlen( c_str, 0 );//cast due to mctools_strlen
    s.buflen = s.size + 1;
    s.owns_memory = 0;
    return s;
  }